

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDebug.c
# Opt level: O0

void Abc_NtkAutoDebug(Abc_Ntk_t *pNtk,_func_int_Abc_Ntk_t_ptr *pFuncError)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  abctime aVar5;
  abctime aVar6;
  Abc_Ntk_t *pNtk_00;
  abctime aVar7;
  abctime clkTotal;
  abctime clk;
  int RandNum;
  int ModNum;
  int nIter;
  int nSteps;
  int i;
  char *pFileName;
  Abc_Ntk_t *pNtkMod;
  _func_int_Abc_Ntk_t_ptr *pFuncError_local;
  Abc_Ntk_t *pNtk_local;
  
  clk._4_4_ = 1;
  aVar5 = Abc_Clock();
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcDebug.c"
                  ,0x38,"void Abc_NtkAutoDebug(Abc_Ntk_t *, int (*)(Abc_Ntk_t *))");
  }
  srand(0x123123);
  pFuncError_local = (_func_int_Abc_Ntk_t_ptr *)Abc_NtkDup(pNtk);
  iVar1 = (*pFuncError)((Abc_Ntk_t *)pFuncError_local);
  if (iVar1 == 0) {
    printf("The original network does not cause the bug. Quitting.\n");
    Abc_NtkDelete((Abc_Ntk_t *)pFuncError_local);
    return;
  }
  RandNum = 0;
  do {
    aVar6 = Abc_Clock();
    iVar1 = Abc_NtkCountFaninsTotal((Abc_Ntk_t *)pFuncError_local);
    uVar2 = iVar1 << 1;
    uVar3 = rand();
    clk._4_4_ = uVar3 ^ clk._4_4_;
    for (nIter = 0; nIter < (int)uVar2; nIter = nIter + 1) {
      iVar1 = (int)(nIter + clk._4_4_) % (int)uVar2;
      pNtk_00 = Abc_NtkAutoDebugModify((Abc_Ntk_t *)pFuncError_local,iVar1 / 2,iVar1 % 2);
      Io_WriteBlifLogic((Abc_Ntk_t *)pFuncError_local,"bug_temp.blif",1);
      iVar1 = (*pFuncError)(pNtk_00);
      if (iVar1 != 0) {
        Abc_NtkDelete((Abc_Ntk_t *)pFuncError_local);
        pFuncError_local = (_func_int_Abc_Ntk_t_ptr *)pNtk_00;
        break;
      }
      Abc_NtkDelete(pNtk_00);
    }
    uVar3 = Abc_NtkLatchNum((Abc_Ntk_t *)pFuncError_local);
    uVar4 = Abc_NtkNodeNum((Abc_Ntk_t *)pFuncError_local);
    printf("Iter %6d : Latches = %6d. Nodes = %6d. Steps = %6d. Error step = %3d.  ",
           (ulong)(uint)RandNum,(ulong)uVar3,(ulong)uVar4,(ulong)uVar2,(ulong)(uint)nIter);
    Abc_Print(1,"%s =","Time");
    aVar7 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar7 - aVar6) * 1.0) / 1000000.0);
    if (nIter == uVar2) {
      Io_WriteBlifLogic((Abc_Ntk_t *)pFuncError_local,"bug_found.blif",1);
      printf("Final network written into file \"%s\". ","bug_found.blif");
      Abc_Print(1,"%s =","Total time");
      aVar6 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar5) * 1.0) / 1000000.0);
      Abc_NtkDelete((Abc_Ntk_t *)pFuncError_local);
      return;
    }
    RandNum = RandNum + 1;
  } while( true );
}

Assistant:

void Abc_NtkAutoDebug( Abc_Ntk_t * pNtk, int (*pFuncError) (Abc_Ntk_t *) )
{
    Abc_Ntk_t * pNtkMod;
    char * pFileName = "bug_found.blif";
    int i, nSteps, nIter, ModNum, RandNum = 1;
    abctime clk, clkTotal = Abc_Clock();
    assert( Abc_NtkIsLogic(pNtk) );
    srand( 0x123123 );
    // create internal copy of the network
    pNtk = Abc_NtkDup(pNtk);
    if ( !(*pFuncError)( pNtk ) )
    {
        printf( "The original network does not cause the bug. Quitting.\n" );
        Abc_NtkDelete( pNtk );
        return;
    }
    // perform incremental modifications
    for ( nIter = 0; ; nIter++ )
    {
        clk = Abc_Clock();
        // count how many ways of modifying the network exists
        nSteps = 2 * Abc_NtkCountFaninsTotal(pNtk);
        // try modifying the network as many times
        RandNum ^= rand();
        for ( i = 0; i < nSteps; i++ )
        {
            // get the shifted number of bug
            ModNum = (i + RandNum) % nSteps;
            // get the modified network
            pNtkMod = Abc_NtkAutoDebugModify( pNtk, ModNum/2, ModNum%2 );
            // write the network
            Io_WriteBlifLogic( pNtk, "bug_temp.blif", 1 );   
            // check if the bug is still there
            if ( (*pFuncError)( pNtkMod ) ) // bug is still there
            {
                Abc_NtkDelete( pNtk );
                pNtk = pNtkMod;
                break;
            }
            else // no bug
                Abc_NtkDelete( pNtkMod );
        }
        printf( "Iter %6d : Latches = %6d. Nodes = %6d. Steps = %6d. Error step = %3d.  ", 
            nIter, Abc_NtkLatchNum(pNtk), Abc_NtkNodeNum(pNtk), nSteps, i );
        ABC_PRT( "Time", Abc_Clock() - clk );
        if ( i == nSteps ) // could not modify it while preserving the bug
            break;
    }
    // write out the final network
    Io_WriteBlifLogic( pNtk, pFileName, 1 );
    printf( "Final network written into file \"%s\". ", pFileName );
    ABC_PRT( "Total time", Abc_Clock() - clkTotal );
    Abc_NtkDelete( pNtk );
}